

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsnew2(prscxdef *ctx,int t,prsndef *n1,prsndef *n2)

{
  prsndef *ppVar1;
  prscxdef *in_RCX;
  prsndef *in_RDX;
  int in_ESI;
  prsndef *n;
  undefined8 in_stack_ffffffffffffffd8;
  
  ppVar1 = prsalo(in_RCX,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  ppVar1->prsntyp = in_ESI;
  ppVar1->prsnnlf = 2;
  (ppVar1->prsnv).prsnvn[0] = in_RDX;
  (ppVar1->prsnv).prsnvn[1] = (prsndef *)in_RCX;
  return ppVar1;
}

Assistant:

prsndef *prsnew2(prscxdef *ctx, int t, prsndef *n1, prsndef *n2)
{
    prsndef *n = prsalo(ctx, 2);
    
    n->prsntyp = t;
    n->prsnnlf = 2;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    return(n);
}